

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  Snapshot *this_00;
  cmMakefile *pcVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t sVar6;
  ulong uVar7;
  pointer ppcVar8;
  string outP;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmGeneratedFileStream fout;
  string local_318;
  string local_2f8;
  long *local_2d8 [2];
  long local_2c8 [2];
  string local_2b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  undefined1 local_278 [584];
  
  pcVar1 = this->Makefile;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_TESTING_ENABLED","");
  bVar3 = cmMakefile::IsOn(pcVar1,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if (bVar3) {
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_2b8,this->Makefile,&local_298,false);
    this_00 = &this->StateSnapshot;
    pcVar4 = cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)local_2d8,pcVar4,(allocator *)local_278);
    std::__cxx11::string::append((char *)local_2d8);
    std::__cxx11::string::append((char *)local_2d8);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,(char *)local_2d8[0],false);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# CMake generated Testfile for ",0x1f);
    std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
    std::ostream::put((char)local_278);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# Source directory: ",0x14);
    pcVar4 = cmState::Snapshot::GetCurrentSourceDirectory(this_00);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,sVar6);
    }
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# Build directory: ",0x13);
    pcVar4 = cmState::Snapshot::GetCurrentBinaryDirectory(this_00);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,sVar6);
    }
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"# ",2);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"# This file includes the relevant testing commands ",0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"required for ",0xd);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"# testing this directory and lists subdirectories to ",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"be tested as well.",0x12);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar1 = this->Makefile;
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"TEST_INCLUDE_FILE","");
    pcVar4 = cmMakefile::GetProperty(pcVar1,&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if (pcVar4 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"include(\"",9);
      sVar6 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar4,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")",2);
      std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
      std::ostream::put((char)local_278);
      std::ostream::flush();
    }
    pcVar1 = this->Makefile;
    ppcVar8 = (pcVar1->TestGenerators).
              super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppcVar8 !=
        (pcVar1->TestGenerators).
        super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        cmScriptGenerator::Generate
                  (&(*ppcVar8)->super_cmScriptGenerator,(ostream *)local_278,&local_2b8,&local_298);
        ppcVar8 = ppcVar8 + 1;
      } while (ppcVar8 !=
               (pcVar1->TestGenerators).
               super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if ((this->Children).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->Children).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"subdirs(",8);
        pcVar4 = cmMakefile::GetCurrentBinaryDirectory
                           ((this->Children).
                            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7]->Makefile);
        std::__cxx11::string::string((string *)&local_318,pcVar4,(allocator *)&local_2f8);
        cmOutputConverter::Convert
                  (&local_2f8,&this->super_cmOutputConverter,&local_318,START_OUTPUT,UNCHANGED);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,")",1);
        cVar2 = (char)(ostream *)local_278;
        std::ios::widen((char)*(undefined8 *)(local_278._0_8_ + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)(this->Children).
                                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->Children).
                                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    if (local_2d8[0] != local_2c8) {
      operator_delete(local_2d8[0],local_2c8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if ( !this->Makefile->IsOn("CMAKE_TESTING_ENABLED") )
    {
    return;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetCurrentBinaryDirectory();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetCurrentSourceDirectory() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetCurrentBinaryDirectory() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if ( testIncludeFile )
    {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
    }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const&
    testers = this->Makefile->GetTestGenerators();
  for(std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
      gi != testers.end(); ++gi)
    {
    (*gi)->Generate(fout, config, configurationTypes);
    }
  if (!this->Children.empty())
    {
    size_t i;
    for(i = 0; i < this->Children.size(); ++i)
      {
      // TODO: Use add_subdirectory instead?
      fout << "subdirs(";
      std::string outP =
        this->Children[i]->GetMakefile()->GetCurrentBinaryDirectory();
      fout << this->Convert(outP,START_OUTPUT);
      fout << ")" << std::endl;
      }
    }
}